

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::update(IMLE *this,Z *z,X *x)

{
  bool bVar1;
  Index IVar2;
  size_type sVar3;
  FastLinearExpert *in_RDI;
  Scal SVar4;
  iterator it;
  Scal sum_zx;
  X *in_stack_00000420;
  Z *in_stack_00000428;
  IMLE *in_stack_00000430;
  string *in_stack_fffffffffffffc68;
  IMLE *in_stack_fffffffffffffc70;
  vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *this_00;
  value_type *in_stack_fffffffffffffc78;
  allocator *paVar5;
  vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> local_378 [5];
  X *in_stack_fffffffffffffd00;
  Z *in_stack_fffffffffffffd08;
  LinearExpert *in_stack_fffffffffffffd10;
  IMLE *in_stack_ffffffffffffff60;
  X *in_stack_ffffffffffffff68;
  Z *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  FastLinearExpert *in_stack_ffffffffffffff80;
  __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
  local_60;
  double local_58;
  allocator local_39;
  string local_38 [56];
  
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc70
                    );
  if ((IVar2 == (in_RDI->super_LinearExpert).d) &&
     (IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         in_stack_fffffffffffffc70), IVar2 == (in_RDI->super_LinearExpert).D)) {
    local_58 = 0.0;
    local_60._M_current =
         (FastLinearExpert *)
         std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
         begin((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
               in_stack_fffffffffffffc68);
    while( true ) {
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::end
                ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)in_stack_fffffffffffffc68);
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                          *)in_stack_fffffffffffffc70,
                         (__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                          *)in_stack_fffffffffffffc68);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
      ::operator->(&local_60);
      SVar4 = LinearExpert::queryZXandH
                        (&in_RDI->super_LinearExpert,(Z *)in_stack_fffffffffffffc78,
                         (X *)in_stack_fffffffffffffc70);
      local_58 = SVar4 + local_58;
      __gnu_cxx::
      __normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
      ::operator++((__normal_iterator<FastLinearExpert_*,_std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>_>
                    *)in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    }
    if ((local_58 <
         (in_RDI->super_LinearExpert).wNu /
         (double)*(int *)&(in_RDI->super_LinearExpert).Szz.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data) ||
       (*(int *)&(in_RDI->super_LinearExpert).Szz.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        == 0)) {
      if (0 < *(int *)&(in_RDI->super_LinearExpert).Nu0.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data) {
        *(int *)&(in_RDI->super_LinearExpert).Nu0.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             *(int *)&(in_RDI->super_LinearExpert).Nu0.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data + -1;
        return;
      }
      this_00 = local_378;
      FastLinearExpert::FastLinearExpert
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
      push_back((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *
                )in_RDI,in_stack_fffffffffffffc78);
      FastLinearExpert::~FastLinearExpert(in_RDI);
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::back
                (this_00);
      LinearExpert::queryH
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      sVar3 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ::size((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      *)&(in_RDI->super_LinearExpert).Sxz);
      *(int *)&(in_RDI->super_LinearExpert).Szz.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (int)sVar3;
    }
    EM(in_stack_00000430,in_stack_00000428,in_stack_00000420);
    *(undefined4 *)
     &(in_RDI->super_LinearExpert).Nu0.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         *(undefined4 *)
          &(in_RDI->super_LinearExpert).invPsi.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    return;
  }
  paVar5 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"IMLE::update: sample point dimensions do not match!!",paVar5);
  message(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::update(Z const &z, X const &x)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d || x.size() != D)
    {
        message("IMLE::update: sample point dimensions do not match!!");
        return;
    }
#endif

    // Query experts
    Scal sum_zx = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_zx += it->queryZXandH(z,x);

    // Create new expert?
    if( sum_zx < pNoiseModelZX / M || M == 0 )
	{
	    if( noise_to_go > 0)
	    {
	        noise_to_go--;
            return;
	    }

        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().queryH(z,x);
        M = experts.size();
	}

    EM(z,x);

	noise_to_go = param.nOutliers;
}